

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

void secp256k1_ecmult_odd_multiples_table
               (int n,secp256k1_ge *pre_a,secp256k1_fe *zr,secp256k1_fe *z,secp256k1_gej *a)

{
  uint64_t *puVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  secp256k1_ge *psVar7;
  uint uVar8;
  secp256k1_fe *extraout_RDX;
  ulong uVar9;
  ulong extraout_RDX_00;
  secp256k1_ge *a_00;
  secp256k1_ge *a_01;
  secp256k1_ge *psVar10;
  uint64_t uVar11;
  ulong uVar12;
  secp256k1_gej *a_02;
  secp256k1_gej *a_03;
  undefined4 in_register_0000003c;
  ulong uVar13;
  secp256k1_gej *r;
  secp256k1_gej *a_04;
  secp256k1_ge *a_05;
  secp256k1_gej *a_06;
  long lVar14;
  secp256k1_fe *psVar15;
  secp256k1_fe *psVar16;
  secp256k1_gej *a_07;
  secp256k1_gej ai;
  secp256k1_gej d;
  secp256k1_ge d_ge;
  secp256k1_fe sStack_5a8;
  secp256k1_fe sStack_578;
  secp256k1_gej *psStack_548;
  secp256k1_gej *psStack_540;
  secp256k1_fe *psStack_538;
  secp256k1_gej *psStack_530;
  secp256k1_gej *psStack_528;
  secp256k1_fe *psStack_518;
  undefined1 auStack_510 [56];
  uint64_t uStack_4d8;
  uint64_t uStack_4d0;
  uint64_t uStack_4c8;
  ulong uStack_4c0;
  ulong uStack_4b8;
  undefined1 auStack_4b0 [56];
  uint64_t uStack_478;
  uint64_t uStack_470;
  uint64_t uStack_468;
  ulong uStack_460;
  ulong uStack_458;
  undefined1 auStack_450 [56];
  uint64_t uStack_418;
  uint64_t uStack_410;
  uint64_t uStack_408;
  uint64_t uStack_400;
  int iStack_3f8;
  secp256k1_fe sStack_3f0;
  secp256k1_fe sStack_3c0;
  secp256k1_fe sStack_390;
  secp256k1_fe sStack_360;
  undefined1 auStack_330 [96];
  code *pcStack_2d0;
  secp256k1_ge *psStack_2c0;
  secp256k1_gej *psStack_2b8;
  secp256k1_ge *psStack_2b0;
  undefined1 *puStack_2a8;
  secp256k1_gej sStack_2a0;
  secp256k1_gej local_1c8;
  secp256k1_gej local_130;
  secp256k1_ge local_98;
  
  psVar10 = (secp256k1_ge *)CONCAT44(in_register_0000003c,n);
  if ((int)z[3].n[0] == 0) {
    secp256k1_gej_double_var(&local_130,(secp256k1_gej *)z,(secp256k1_fe *)0x0);
    secp256k1_ge_set_xy(&local_98,&local_130.x,&local_130.y);
    secp256k1_ge_set_gej_zinv(psVar10,(secp256k1_gej *)z,&local_130.z);
    secp256k1_gej_set_ge(&local_1c8,psVar10);
    local_1c8.z.n[0] = z[2].n[0];
    local_1c8.z.n[1] = z[2].n[1];
    local_1c8.z.n[2] = z[2].n[2];
    local_1c8.z.n[3] = z[2].n[3];
    local_1c8.z.n[4] = z[2].n[4];
    local_1c8.z.magnitude = z[2].magnitude;
    local_1c8.z.normalized = z[2].normalized;
    (pre_a->x).n[4] = local_130.z.n[4];
    (pre_a->x).magnitude = local_130.z.magnitude;
    (pre_a->x).normalized = local_130.z.normalized;
    (pre_a->x).n[2] = local_130.z.n[2];
    (pre_a->x).n[3] = local_130.z.n[3];
    (pre_a->x).n[0] = local_130.z.n[0];
    (pre_a->x).n[1] = local_130.z.n[1];
    lVar14 = 0x30;
    do {
      psVar10 = psVar10 + 1;
      secp256k1_gej_add_ge_var
                (&local_1c8,&local_1c8,&local_98,(secp256k1_fe *)((long)(pre_a->x).n + lVar14));
      secp256k1_ge_set_xy(psVar10,&local_1c8.x,&local_1c8.y);
      lVar14 = lVar14 + 0x30;
    } while (lVar14 != 0xc0);
    secp256k1_fe_mul(zr,&local_1c8.z,&local_130.z);
    return;
  }
  secp256k1_ecmult_odd_multiples_table_cold_1();
  psVar7 = pre_a;
  psVar15 = extraout_RDX;
  psStack_2b0 = psVar10;
  if (psVar10 != (secp256k1_ge *)0x0) {
    do {
      psStack_2b8 = (secp256k1_gej *)0x11a59c;
      secp256k1_ge_verify(psVar7);
      psStack_2b8 = (secp256k1_gej *)0x11a5a4;
      secp256k1_fe_verify(psVar15);
      psVar15 = psVar15 + 1;
      psVar10 = (secp256k1_ge *)&psVar10[-1].field_0x67;
      psVar7 = psVar7 + 1;
    } while (psVar10 != (secp256k1_ge *)0x0);
    psVar15 = (secp256k1_fe *)&psStack_2b0[-1].field_0x67;
    psVar16 = &pre_a[(long)psVar15].y;
    psStack_2b8 = (secp256k1_gej *)0x11a5cd;
    secp256k1_fe_verify(psVar16);
    uVar6 = pre_a[(long)psVar15].y.n[4];
    uVar9 = (uVar6 >> 0x30) * 0x1000003d1 + psVar16->n[0];
    uVar5 = (uVar9 >> 0x34) + pre_a[(long)psVar15].y.n[1];
    uVar12 = (uVar5 >> 0x34) + pre_a[(long)psVar15].y.n[2];
    uVar13 = (uVar12 >> 0x34) + pre_a[(long)psVar15].y.n[3];
    a_02 = (secp256k1_gej *)(uVar12 & 0xfffffffffffff);
    psVar16->n[0] = uVar9 & 0xfffffffffffff;
    pre_a[(long)psVar15].y.n[1] = uVar5 & 0xfffffffffffff;
    pre_a[(long)psVar15].y.n[2] = (uint64_t)a_02;
    pre_a[(long)psVar15].y.n[3] = uVar13 & 0xfffffffffffff;
    pre_a[(long)psVar15].y.n[4] = (uVar13 >> 0x34) + (uVar6 & 0xffffffffffff);
    pre_a[(long)psVar15].y.magnitude = 1;
    psStack_2b8 = (secp256k1_gej *)0x11a662;
    secp256k1_fe_verify(psVar16);
    sStack_2a0.x.n[0] = extraout_RDX[(long)psVar15].n[0];
    sStack_2a0.x.n[1] = extraout_RDX[(long)psVar15].n[1];
    sStack_2a0.x.n[2] = extraout_RDX[(long)psVar15].n[2];
    sStack_2a0.x.n[3] = (extraout_RDX[(long)psVar15].n + 2)[1];
    sStack_2a0.x.n[4] = extraout_RDX[(long)psVar15].n[4];
    sStack_2a0.x._40_8_ = (extraout_RDX[(long)psVar15].n + 4)[1];
    psVar10 = psStack_2b0;
    puStack_2a8 = (undefined1 *)psVar15;
    if (psVar15 != (secp256k1_fe *)0x0) {
      a_05 = pre_a + (long)&psStack_2b0[-1].field_0x66;
      psVar16 = extraout_RDX + (long)psStack_2b0;
      uVar11 = 0;
      psVar7 = psStack_2b0;
      do {
        psVar16 = psVar16 + -1;
        if (uVar11 != 0) {
          psStack_2b8 = (secp256k1_gej *)0x11a6db;
          a_02 = &sStack_2a0;
          secp256k1_fe_mul(&sStack_2a0.x,&sStack_2a0.x,psVar16);
        }
        psStack_2b8 = (secp256k1_gej *)0x11a6e3;
        secp256k1_ge_verify(a_05);
        psStack_2b8 = (secp256k1_gej *)0x11a6eb;
        r = &sStack_2a0;
        secp256k1_fe_verify(&sStack_2a0.x);
        if (a_05->infinity != 0) {
          psStack_2b8 = (secp256k1_gej *)secp256k1_ecmult_table_get_ge_storage;
          secp256k1_ge_table_set_globalz_cold_1();
          psStack_2c0 = pre_a;
          psStack_2b8 = &sStack_2a0;
          if ((extraout_RDX_00 & 1) == 0) {
            pcStack_2d0 = (code *)0x11a847;
            secp256k1_ecmult_table_get_ge_storage_cold_3();
LAB_0011a847:
            pcStack_2d0 = (code *)0x11a84c;
            secp256k1_ecmult_table_get_ge_storage_cold_2();
          }
          else {
            uVar8 = (uint)extraout_RDX_00;
            if ((int)uVar8 < -7) goto LAB_0011a847;
            if ((int)uVar8 < 8) {
              if (0 < (int)uVar8) {
                secp256k1_ge_from_storage
                          ((secp256k1_ge *)r,
                           (secp256k1_ge_storage *)((long)&a_02->x + (ulong)(uVar8 - 1 >> 1) * 0x40)
                          );
                return;
              }
              pcStack_2d0 = (code *)0x11a7d4;
              secp256k1_ge_from_storage
                        ((secp256k1_ge *)r,
                         (secp256k1_ge_storage *)((long)&a_02->x + (ulong)(~uVar8 >> 1) * 0x40));
              psVar15 = &r->y;
              pcStack_2d0 = (code *)0x11a7e0;
              secp256k1_fe_verify(psVar15);
              pcStack_2d0 = (code *)0x11a7ed;
              secp256k1_fe_verify_magnitude(psVar15,1);
              uVar11 = (r->y).n[1];
              uVar2 = (r->y).n[2];
              uVar3 = (r->y).n[3];
              (r->y).n[0] = 0x3ffffbfffff0bc - (r->y).n[0];
              (r->y).n[1] = 0x3ffffffffffffc - uVar11;
              (r->y).n[2] = 0x3ffffffffffffc - uVar2;
              (r->y).n[3] = 0x3ffffffffffffc - uVar3;
              (r->y).n[4] = 0x3fffffffffffc - (r->y).n[4];
              (r->y).magnitude = 2;
              (r->y).normalized = 0;
              secp256k1_fe_verify(psVar15);
              return;
            }
          }
          pcStack_2d0 = secp256k1_gej_add_zinv_var;
          secp256k1_ecmult_table_get_ge_storage_cold_1();
          psStack_528 = (secp256k1_gej *)0x11a876;
          auStack_330._56_8_ = pre_a;
          auStack_330._64_8_ = a_05;
          auStack_330._72_8_ = psVar15;
          auStack_330._80_8_ = &sStack_2a0;
          auStack_330._88_8_ = psVar16;
          pcStack_2d0 = (code *)uVar11;
          secp256k1_gej_verify(a_02);
          psStack_528 = (secp256k1_gej *)0x11a87e;
          secp256k1_ge_verify(a_00);
          psStack_528 = (secp256k1_gej *)0x11a886;
          secp256k1_fe_verify(&psVar7->x);
          if (a_02->infinity != 0) {
            r->infinity = a_00->infinity;
            psStack_528 = (secp256k1_gej *)0x11a8b2;
            secp256k1_fe_sqr(&sStack_3f0,&psVar7->x);
            psStack_528 = (secp256k1_gej *)0x11a8c8;
            secp256k1_fe_mul(&sStack_360,&sStack_3f0,&psVar7->x);
            psStack_528 = (secp256k1_gej *)0x11a8d6;
            secp256k1_fe_mul(&r->x,&a_00->x,&sStack_3f0);
            psStack_528 = (secp256k1_gej *)0x11a8e9;
            secp256k1_fe_mul(&r->y,&a_00->y,&sStack_360);
            a_02 = (secp256k1_gej *)&r->z;
            (r->z).n[0] = 1;
            (r->z).n[1] = 0;
            (r->z).n[2] = 0;
            (r->z).n[3] = 0;
            (r->z).n[4] = 0;
            (r->z).magnitude = 1;
            (r->z).normalized = 1;
LAB_0011a914:
            psStack_528 = (secp256k1_gej *)0x11a919;
            secp256k1_fe_verify(&a_02->x);
            psStack_528 = (secp256k1_gej *)0x11a921;
            secp256k1_gej_verify(r);
            return;
          }
          if (a_00->infinity != 0) {
            memcpy(r,a_02,0x98);
            return;
          }
          psStack_518 = &a_02->z;
          psStack_528 = (secp256k1_gej *)0x11a978;
          secp256k1_fe_mul(&sStack_3f0,psStack_518,&psVar7->x);
          psVar15 = &sStack_360;
          psStack_528 = (secp256k1_gej *)0x11a98b;
          secp256k1_fe_sqr(psVar15,&sStack_3f0);
          sStack_390.n[0] = (a_02->x).n[0];
          sStack_390.n[1] = (a_02->x).n[1];
          sStack_390.n[2] = (a_02->x).n[2];
          sStack_390.n[3] = (a_02->x).n[3];
          sStack_390.n[4] = (a_02->x).n[4];
          sStack_390.magnitude = (a_02->x).magnitude;
          sStack_390.normalized = (a_02->x).normalized;
          psStack_528 = (secp256k1_gej *)0x11a9c0;
          secp256k1_fe_mul((secp256k1_fe *)(auStack_450 + 0x30),&a_00->x,psVar15);
          auStack_4b0._0_8_ = (a_02->y).n[0];
          auStack_4b0._8_8_ = (a_02->y).n[1];
          auStack_4b0._16_8_ = (a_02->y).n[2];
          auStack_4b0._24_8_ = (a_02->y).n[3];
          auStack_4b0._32_8_ = (a_02->y).n[4];
          auStack_4b0._40_4_ = (a_02->y).magnitude;
          auStack_4b0._44_4_ = (a_02->y).normalized;
          psStack_528 = (secp256k1_gej *)0x11a9fe;
          secp256k1_fe_mul(&sStack_3c0,&a_00->y,psVar15);
          psStack_528 = (secp256k1_gej *)0x11aa11;
          secp256k1_fe_mul(&sStack_3c0,&sStack_3c0,&sStack_3f0);
          psStack_528 = (secp256k1_gej *)0x11aa19;
          secp256k1_fe_verify(&sStack_390);
          a_03 = (secp256k1_gej *)0x4;
          psStack_528 = (secp256k1_gej *)0x11aa26;
          secp256k1_fe_verify_magnitude(&sStack_390,4);
          auStack_4b0._48_8_ = 0x9ffff5ffffd9d6 - sStack_390.n[0];
          uStack_478 = 0x9ffffffffffff6 - sStack_390.n[1];
          a_07 = (secp256k1_gej *)(auStack_4b0 + 0x30);
          uStack_470 = 0x9ffffffffffff6 - sStack_390.n[2];
          uStack_468 = 0x9ffffffffffff6 - sStack_390.n[3];
          uStack_460 = 0x9fffffffffff6 - sStack_390.n[4];
          uStack_458 = 5;
          psStack_528 = (secp256k1_gej *)0x11aa75;
          secp256k1_fe_verify((secp256k1_fe *)a_07);
          psStack_528 = (secp256k1_gej *)0x11aa7d;
          secp256k1_fe_verify((secp256k1_fe *)a_07);
          a_06 = (secp256k1_gej *)(auStack_450 + 0x30);
          psStack_528 = (secp256k1_gej *)0x11aa8d;
          a_04 = a_06;
          secp256k1_fe_verify((secp256k1_fe *)a_06);
          if (iStack_3f8 + (int)uStack_458 < 0x21) {
            auStack_4b0._48_8_ = auStack_4b0._48_8_ + auStack_450._48_8_;
            uStack_478 = uStack_478 + uStack_418;
            uStack_470 = uStack_470 + uStack_410;
            uStack_468 = uStack_468 + uStack_408;
            uStack_460 = uStack_460 + uStack_400;
            psVar15 = (secp256k1_fe *)0x3fffffffffffc;
            uStack_458 = (ulong)(uint)(iStack_3f8 + (int)uStack_458);
            psStack_528 = (secp256k1_gej *)0x11aaf0;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_4b0 + 0x30));
            psStack_528 = (secp256k1_gej *)0x11ab00;
            secp256k1_fe_verify(&sStack_3c0);
            a_03 = (secp256k1_gej *)0x1;
            psStack_528 = (secp256k1_gej *)0x11ab0d;
            secp256k1_fe_verify_magnitude(&sStack_3c0,1);
            auStack_510._48_8_ = 0x3ffffbfffff0bc - sStack_3c0.n[0];
            uStack_4d8 = 0x3ffffffffffffc - sStack_3c0.n[1];
            a_06 = (secp256k1_gej *)(auStack_510 + 0x30);
            uStack_4d0 = 0x3ffffffffffffc - sStack_3c0.n[2];
            uStack_4c8 = 0x3ffffffffffffc - sStack_3c0.n[3];
            uStack_4c0 = 0x3fffffffffffc - sStack_3c0.n[4];
            uStack_4b8 = 2;
            psStack_528 = (secp256k1_gej *)0x11ab57;
            secp256k1_fe_verify((secp256k1_fe *)a_06);
            psStack_528 = (secp256k1_gej *)0x11ab5f;
            secp256k1_fe_verify((secp256k1_fe *)a_06);
            a_07 = (secp256k1_gej *)auStack_4b0;
            psStack_528 = (secp256k1_gej *)0x11ab6c;
            a_04 = a_07;
            secp256k1_fe_verify((secp256k1_fe *)a_07);
            if (0x20 < auStack_4b0._40_4_ + (int)uStack_4b8) goto LAB_0011b038;
            auStack_510._48_8_ = auStack_510._48_8_ + auStack_4b0._0_8_;
            uStack_4d8 = uStack_4d8 + auStack_4b0._8_8_;
            uStack_4d0 = uStack_4d0 + auStack_4b0._16_8_;
            uStack_4c8 = uStack_4c8 + auStack_4b0._24_8_;
            uStack_4c0 = uStack_4c0 + auStack_4b0._32_8_;
            uStack_4b8 = (ulong)(uint)(auStack_4b0._40_4_ + (int)uStack_4b8);
            psStack_528 = (secp256k1_gej *)0x11abd3;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_510 + 0x30));
            psStack_528 = (secp256k1_gej *)0x11abe3;
            secp256k1_fe_verify((secp256k1_fe *)(auStack_4b0 + 0x30));
            uVar6 = (uStack_460 >> 0x30) * 0x1000003d1 + auStack_4b0._48_8_;
            if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0))
            {
              uVar5 = (uVar6 >> 0x34) + uStack_478;
              uVar9 = (uVar5 >> 0x34) + uStack_470;
              uVar12 = (uVar9 >> 0x34) + uStack_468;
              uVar13 = (uVar12 >> 0x34) + (uStack_460 & 0xffffffffffff);
              if ((((uVar5 | uVar6 | uVar9 | uVar12) & 0xfffffffffffff) == 0 && uVar13 == 0) ||
                 (((uVar6 | 0x1000003d0) & uVar5 & uVar9 & uVar12 & (uVar13 ^ 0xf000000000000)) ==
                  0xfffffffffffff)) {
                psStack_528 = (secp256k1_gej *)0x11af75;
                secp256k1_fe_verify((secp256k1_fe *)(auStack_510 + 0x30));
                uVar6 = (uStack_4c0 >> 0x30) * 0x1000003d1 + auStack_510._48_8_;
                if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) ||
                   ((uVar6 & 0xfffffffffffff) == 0)) {
                  uVar5 = (uVar6 >> 0x34) + uStack_4d8;
                  uVar9 = (uVar5 >> 0x34) + uStack_4d0;
                  uVar12 = (uVar9 >> 0x34) + uStack_4c8;
                  uVar13 = (uVar12 >> 0x34) + (uStack_4c0 & 0xffffffffffff);
                  if ((((uVar5 | uVar6 | uVar9 | uVar12) & 0xfffffffffffff) == 0 && uVar13 == 0) ||
                     (((uVar6 | 0x1000003d0) & uVar5 & uVar9 & uVar12 & (uVar13 ^ 0xf000000000000))
                      == 0xfffffffffffff)) {
                    psStack_528 = (secp256k1_gej *)0x11b02e;
                    secp256k1_gej_double_var(r,a_02,(secp256k1_fe *)0x0);
                    return;
                  }
                }
                psStack_528 = (secp256k1_gej *)0x11b01c;
                secp256k1_gej_set_infinity(r);
                return;
              }
            }
            r->infinity = 0;
            a_07 = (secp256k1_gej *)(auStack_4b0 + 0x30);
            psStack_528 = (secp256k1_gej *)0x11acc0;
            secp256k1_fe_mul(&r->z,psStack_518,(secp256k1_fe *)a_07);
            a_02 = (secp256k1_gej *)auStack_330;
            psStack_528 = (secp256k1_gej *)0x11acd3;
            secp256k1_fe_sqr((secp256k1_fe *)a_02,(secp256k1_fe *)a_07);
            psStack_528 = (secp256k1_gej *)0x11acdb;
            secp256k1_fe_verify((secp256k1_fe *)a_02);
            psStack_528 = (secp256k1_gej *)0x11ace8;
            secp256k1_fe_verify_magnitude((secp256k1_fe *)a_02,1);
            auStack_330._0_8_ = 0x3ffffbfffff0bc - auStack_330._0_8_;
            auStack_330._8_8_ = 0x3ffffffffffffc - auStack_330._8_8_;
            auStack_330._16_8_ = 0x3ffffffffffffc - auStack_330._16_8_;
            auStack_330._24_8_ = 0x3ffffffffffffc - auStack_330._24_8_;
            psVar15 = (secp256k1_fe *)(0x3fffffffffffc - auStack_330._32_8_);
            auStack_330._40_4_ = 2;
            auStack_330._44_4_ = 0;
            psStack_528 = (secp256k1_gej *)0x11ad26;
            auStack_330._32_8_ = psVar15;
            secp256k1_fe_verify((secp256k1_fe *)a_02);
            a_06 = (secp256k1_gej *)auStack_510;
            psStack_528 = (secp256k1_gej *)0x11ad39;
            secp256k1_fe_mul((secp256k1_fe *)a_06,(secp256k1_fe *)a_02,(secp256k1_fe *)a_07);
            psStack_528 = (secp256k1_gej *)0x11ad51;
            secp256k1_fe_mul((secp256k1_fe *)auStack_450,&sStack_390,(secp256k1_fe *)a_02);
            a_03 = (secp256k1_gej *)(auStack_510 + 0x30);
            psStack_528 = (secp256k1_gej *)0x11ad5e;
            secp256k1_fe_sqr(&r->x,(secp256k1_fe *)a_03);
            psStack_528 = (secp256k1_gej *)0x11ad66;
            secp256k1_fe_verify(&r->x);
            psStack_528 = (secp256k1_gej *)0x11ad6e;
            a_04 = a_06;
            secp256k1_fe_verify((secp256k1_fe *)a_06);
            iVar4 = auStack_510._40_4_ + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011b03d;
            uVar11 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            (r->x).n[0] = (r->x).n[0] + auStack_510._0_8_;
            (r->x).n[1] = uVar11 + auStack_510._8_8_;
            (r->x).n[2] = uVar2 + auStack_510._16_8_;
            (r->x).n[3] = uVar3 + auStack_510._24_8_;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + auStack_510._32_8_;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_528 = (secp256k1_gej *)0x11adb8;
            secp256k1_fe_verify(&r->x);
            psStack_528 = (secp256k1_gej *)0x11adc0;
            secp256k1_fe_verify(&r->x);
            a_02 = (secp256k1_gej *)auStack_450;
            psStack_528 = (secp256k1_gej *)0x11add0;
            a_04 = a_02;
            secp256k1_fe_verify((secp256k1_fe *)a_02);
            iVar4 = auStack_450._40_4_ + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011b042;
            uVar11 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            a_02 = (secp256k1_gej *)auStack_450;
            (r->x).n[0] = (r->x).n[0] + auStack_450._0_8_;
            (r->x).n[1] = uVar11 + auStack_450._8_8_;
            (r->x).n[2] = uVar2 + auStack_450._16_8_;
            (r->x).n[3] = uVar3 + auStack_450._24_8_;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + auStack_450._32_8_;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_528 = (secp256k1_gej *)0x11ae1f;
            secp256k1_fe_verify(&r->x);
            psStack_528 = (secp256k1_gej *)0x11ae27;
            secp256k1_fe_verify(&r->x);
            psStack_528 = (secp256k1_gej *)0x11ae2f;
            a_04 = a_02;
            secp256k1_fe_verify((secp256k1_fe *)a_02);
            iVar4 = auStack_450._40_4_ + (r->x).magnitude;
            if (0x20 < iVar4) goto LAB_0011b047;
            uVar11 = (r->x).n[1];
            uVar2 = (r->x).n[2];
            uVar3 = (r->x).n[3];
            a_02 = (secp256k1_gej *)auStack_450;
            (r->x).n[0] = (r->x).n[0] + auStack_450._0_8_;
            (r->x).n[1] = uVar11 + auStack_450._8_8_;
            (r->x).n[2] = uVar2 + auStack_450._16_8_;
            (r->x).n[3] = uVar3 + auStack_450._24_8_;
            puVar1 = (r->x).n + 4;
            *puVar1 = *puVar1 + auStack_450._32_8_;
            (r->x).magnitude = iVar4;
            (r->x).normalized = 0;
            psStack_528 = (secp256k1_gej *)0x11ae7e;
            secp256k1_fe_verify(&r->x);
            psStack_528 = (secp256k1_gej *)0x11ae86;
            secp256k1_fe_verify((secp256k1_fe *)a_02);
            psStack_528 = (secp256k1_gej *)0x11ae8e;
            a_04 = r;
            secp256k1_fe_verify(&r->x);
            iVar4 = (r->x).magnitude + auStack_450._40_4_;
            if (iVar4 < 0x21) {
              auStack_450._0_8_ = (r->x).n[0] + auStack_450._0_8_;
              auStack_450._8_8_ = (r->x).n[1] + auStack_450._8_8_;
              auStack_450._16_8_ = (r->x).n[2] + auStack_450._16_8_;
              auStack_450._24_8_ = (r->x).n[3] + auStack_450._24_8_;
              auStack_450._32_8_ = auStack_450._32_8_ + (r->x).n[4];
              auStack_450._44_4_ = 0;
              psStack_528 = (secp256k1_gej *)0x11aee1;
              auStack_450._40_4_ = iVar4;
              secp256k1_fe_verify((secp256k1_fe *)auStack_450);
              a_02 = (secp256k1_gej *)&r->y;
              psStack_528 = (secp256k1_gej *)0x11aef5;
              secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)auStack_450,
                               (secp256k1_fe *)(auStack_510 + 0x30));
              a_07 = (secp256k1_gej *)auStack_510;
              psStack_528 = (secp256k1_gej *)0x11af0a;
              a_03 = a_07;
              secp256k1_fe_mul((secp256k1_fe *)a_07,(secp256k1_fe *)a_07,(secp256k1_fe *)auStack_4b0
                              );
              psStack_528 = (secp256k1_gej *)0x11af12;
              secp256k1_fe_verify((secp256k1_fe *)a_02);
              psStack_528 = (secp256k1_gej *)0x11af1a;
              a_04 = a_07;
              secp256k1_fe_verify((secp256k1_fe *)a_07);
              iVar4 = auStack_510._40_4_ + (r->y).magnitude;
              if (iVar4 < 0x21) {
                uVar11 = (r->y).n[1];
                uVar2 = (r->y).n[2];
                uVar3 = (r->y).n[3];
                (r->y).n[0] = (r->y).n[0] + auStack_510._0_8_;
                (r->y).n[1] = uVar11 + auStack_510._8_8_;
                (r->y).n[2] = uVar2 + auStack_510._16_8_;
                (r->y).n[3] = uVar3 + auStack_510._24_8_;
                puVar1 = (r->y).n + 4;
                *puVar1 = *puVar1 + auStack_510._32_8_;
                (r->y).magnitude = iVar4;
                (r->y).normalized = 0;
                goto LAB_0011a914;
              }
              goto LAB_0011b051;
            }
          }
          else {
            psStack_528 = (secp256k1_gej *)0x11b038;
            secp256k1_gej_add_zinv_var_cold_7();
LAB_0011b038:
            psStack_528 = (secp256k1_gej *)0x11b03d;
            secp256k1_gej_add_zinv_var_cold_6();
LAB_0011b03d:
            psStack_528 = (secp256k1_gej *)0x11b042;
            secp256k1_gej_add_zinv_var_cold_5();
LAB_0011b042:
            psStack_528 = (secp256k1_gej *)0x11b047;
            secp256k1_gej_add_zinv_var_cold_4();
LAB_0011b047:
            psStack_528 = (secp256k1_gej *)0x11b04c;
            secp256k1_gej_add_zinv_var_cold_3();
          }
          psStack_528 = (secp256k1_gej *)0x11b051;
          secp256k1_gej_add_zinv_var_cold_2();
LAB_0011b051:
          psStack_528 = (secp256k1_gej *)secp256k1_ge_set_gej_zinv;
          secp256k1_gej_add_zinv_var_cold_1();
          psStack_548 = r;
          psStack_540 = a_06;
          psStack_538 = psVar15;
          psStack_530 = a_02;
          psStack_528 = a_07;
          secp256k1_gej_verify(a_03);
          psVar10 = a_01;
          secp256k1_fe_verify(&a_01->x);
          if (a_03->infinity == 0) {
            secp256k1_fe_sqr(&sStack_578,&a_01->x);
            secp256k1_fe_mul(&sStack_5a8,&sStack_578,&a_01->x);
            secp256k1_fe_mul(&a_04->x,&a_03->x,&sStack_578);
            secp256k1_fe_mul(&a_04->y,&a_03->y,&sStack_5a8);
            *(int *)(a_04->z).n = a_03->infinity;
            secp256k1_ge_verify((secp256k1_ge *)a_04);
            return;
          }
          secp256k1_ge_set_gej_zinv_cold_1();
          psVar10->infinity = 1;
          (psVar10->x).n[0] = 0;
          (psVar10->x).n[1] = 0;
          (psVar10->x).n[2] = 0;
          (psVar10->x).n[3] = 0;
          *(undefined8 *)((long)(psVar10->x).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar10->x).n + 0x24) = 0;
          (psVar10->x).normalized = 1;
          secp256k1_fe_verify(&psVar10->x);
          *(undefined8 *)((long)(psVar10->y).n + 0x1c) = 0;
          *(undefined8 *)((long)(psVar10->y).n + 0x24) = 0;
          (psVar10->y).n[2] = 0;
          (psVar10->y).n[3] = 0;
          (psVar10->y).n[0] = 0;
          (psVar10->y).n[1] = 0;
          (psVar10->y).normalized = 1;
          secp256k1_fe_verify(&psVar10->y);
          secp256k1_ge_verify(psVar10);
          return;
        }
        psVar15 = (secp256k1_fe *)(sStack_2a0.z.n + 1);
        psStack_2b8 = (secp256k1_gej *)0x11a707;
        secp256k1_fe_sqr(psVar15,&sStack_2a0.x);
        psStack_2b8 = (secp256k1_gej *)0x11a717;
        secp256k1_fe_mul((secp256k1_fe *)(sStack_2a0.y.n + 1),psVar15,&sStack_2a0.x);
        psStack_2b8 = (secp256k1_gej *)0x11a725;
        secp256k1_fe_mul(&a_05->x,&a_05->x,psVar15);
        a_02 = (secp256k1_gej *)&a_05->y;
        psStack_2b8 = (secp256k1_gej *)0x11a737;
        secp256k1_fe_mul((secp256k1_fe *)a_02,(secp256k1_fe *)a_02,
                         (secp256k1_fe *)(sStack_2a0.y.n + 1));
        psStack_2b8 = (secp256k1_gej *)0x11a73f;
        secp256k1_ge_verify(a_05);
        uVar11 = uVar11 + 1;
        a_05 = a_05 + -1;
        psVar10 = psStack_2b0;
      } while (puStack_2a8 != (undefined1 *)uVar11);
    }
    do {
      psStack_2b8 = (secp256k1_gej *)0x11a761;
      secp256k1_ge_verify(pre_a);
      pre_a = pre_a + 1;
      psVar7 = psVar10 + -1;
      psVar10 = (secp256k1_ge *)&psVar7->field_0x67;
    } while (&psVar7->field_0x67 != (undefined1 *)0x0);
  }
  return;
}

Assistant:

static void secp256k1_ecmult_odd_multiples_table(int n, secp256k1_ge *pre_a, secp256k1_fe *zr, secp256k1_fe *z, const secp256k1_gej *a) {
    secp256k1_gej d, ai;
    secp256k1_ge d_ge;
    int i;

    VERIFY_CHECK(!a->infinity);

    secp256k1_gej_double_var(&d, a, NULL);

    /*
     * Perform the additions using an isomorphic curve Y^2 = X^3 + 7*C^6 where C := d.z.
     * The isomorphism, phi, maps a secp256k1 point (x, y) to the point (x*C^2, y*C^3) on the other curve.
     * In Jacobian coordinates phi maps (x, y, z) to (x*C^2, y*C^3, z) or, equivalently to (x, y, z/C).
     *
     *     phi(x, y, z) = (x*C^2, y*C^3, z) = (x, y, z/C)
     *   d_ge := phi(d) = (d.x, d.y, 1)
     *     ai := phi(a) = (a.x*C^2, a.y*C^3, a.z)
     *
     * The group addition functions work correctly on these isomorphic curves.
     * In particular phi(d) is easy to represent in affine coordinates under this isomorphism.
     * This lets us use the faster secp256k1_gej_add_ge_var group addition function that we wouldn't be able to use otherwise.
     */
    secp256k1_ge_set_xy(&d_ge, &d.x, &d.y);
    secp256k1_ge_set_gej_zinv(&pre_a[0], a, &d.z);
    secp256k1_gej_set_ge(&ai, &pre_a[0]);
    ai.z = a->z;

    /* pre_a[0] is the point (a.x*C^2, a.y*C^3, a.z*C) which is equivalent to a.
     * Set zr[0] to C, which is the ratio between the omitted z(pre_a[0]) value and a.z.
     */
    zr[0] = d.z;

    for (i = 1; i < n; i++) {
        secp256k1_gej_add_ge_var(&ai, &ai, &d_ge, &zr[i]);
        secp256k1_ge_set_xy(&pre_a[i], &ai.x, &ai.y);
    }

    /* Multiply the last z-coordinate by C to undo the isomorphism.
     * Since the z-coordinates of the pre_a values are implied by the zr array of z-coordinate ratios,
     * undoing the isomorphism here undoes the isomorphism for all pre_a values.
     */
    secp256k1_fe_mul(z, &ai.z, &d.z);
}